

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O3

vector<int,_std::allocator<int>_> *
mxx::allgatherv<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,int *data,size_t size,
          comm *comm)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  size_t local_30;
  
  local_30 = size;
  allgather<unsigned_long>(&local_48,&local_30,1,comm);
  allgatherv<int>(__return_storage_ptr__,data,local_30,&local_48,comm);
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> allgatherv(const T* data, size_t size, const mxx::comm& comm = mxx::comm()) {
    // recv_sizes is unknown -> first collect via gather
    std::vector<size_t> recv_sizes = allgather(size, comm);
    return allgatherv(data, size, recv_sizes, comm);
}